

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::AutoReg::registerTestCase
          (AutoReg *this,ITestCase *testCase,char *classOrQualifiedMethodName,
          NameAndDesc *nameAndDesc,SourceLineInfo *lineInfo)

{
  IMutableRegistryHub *pIVar1;
  TestCase local_1d8;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  SourceLineInfo *local_40;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  
  local_40 = lineInfo;
  pIVar1 = getMutableRegistryHub();
  std::__cxx11::string::string((string *)&local_c0,classOrQualifiedMethodName,&local_33);
  extractClassName(&local_a0,&local_c0);
  std::__cxx11::string::string((string *)&local_80,nameAndDesc->name,&local_32);
  std::__cxx11::string::string((string *)&local_60,nameAndDesc->description,&local_31);
  makeTestCase(&local_1d8,testCase,&local_a0,&local_80,&local_60,local_40);
  (*pIVar1->_vptr_IMutableRegistryHub[3])(pIVar1,&local_1d8);
  TestCase::~TestCase(&local_1d8);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  return;
}

Assistant:

void AutoReg::registerTestCase( ITestCase* testCase,
                                    char const* classOrQualifiedMethodName,
                                    NameAndDesc const& nameAndDesc,
                                    SourceLineInfo const& lineInfo ) {

        getMutableRegistryHub().registerTest
            ( makeTestCase( testCase,
                            extractClassName( classOrQualifiedMethodName ),
                            nameAndDesc.name,
                            nameAndDesc.description,
                            lineInfo ) );
    }